

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsocks5socketengine_p.cpp
# Opt level: O0

void QSocks5SocketEngine::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSocks5SocketEnginePrivate *pQVar1;
  QMetaType QVar2;
  QSocks5SocketEnginePrivate *in_RCX;
  uint in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  SocketError error;
  long in_FS_OFFSET;
  QSocks5SocketEngine *_t;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QMetaType local_28;
  QMetaTypeInterface *local_20;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  error = (SocketError)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    pQVar1 = (QSocks5SocketEnginePrivate *)(ulong)in_EDX;
    switch(pQVar1) {
    case (QSocks5SocketEnginePrivate *)0x0:
      d_func((QSocks5SocketEngine *)0x3757b0);
      QSocks5SocketEnginePrivate::_q_controlSocketConnected(pQVar1);
      break;
    case (QSocks5SocketEnginePrivate *)0x1:
      d_func((QSocks5SocketEngine *)0x3757c7);
      QSocks5SocketEnginePrivate::_q_controlSocketReadNotification
                ((QSocks5SocketEnginePrivate *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      break;
    case (QSocks5SocketEnginePrivate *)0x2:
      d_func((QSocks5SocketEngine *)0x3757de);
      QSocks5SocketEnginePrivate::_q_controlSocketErrorOccurred(in_RCX,error);
      break;
    case (QSocks5SocketEnginePrivate *)0x3:
      d_func((QSocks5SocketEngine *)0x375800);
      QSocks5SocketEnginePrivate::_q_udpSocketReadNotification
                ((QSocks5SocketEnginePrivate *)CONCAT44(in_ESI,in_EDX));
      break;
    case (QSocks5SocketEnginePrivate *)0x4:
      d_func((QSocks5SocketEngine *)0x375817);
      QSocks5SocketEnginePrivate::_q_controlSocketBytesWritten
                ((QSocks5SocketEnginePrivate *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      break;
    case (QSocks5SocketEnginePrivate *)0x5:
      d_func((QSocks5SocketEngine *)0x37582b);
      QSocks5SocketEnginePrivate::_q_emitPendingReadNotification(pQVar1);
      break;
    case (QSocks5SocketEnginePrivate *)0x6:
      d_func((QSocks5SocketEngine *)0x37583f);
      QSocks5SocketEnginePrivate::_q_emitPendingWriteNotification
                ((QSocks5SocketEnginePrivate *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      break;
    case (QSocks5SocketEnginePrivate *)0x7:
      d_func((QSocks5SocketEngine *)0x375853);
      QSocks5SocketEnginePrivate::_q_emitPendingConnectionNotification
                ((QSocks5SocketEnginePrivate *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      break;
    case (QSocks5SocketEnginePrivate *)0x8:
      pQVar1 = d_func((QSocks5SocketEngine *)0x375867);
      QSocks5SocketEnginePrivate::_q_controlSocketDisconnected(pQVar1);
      break;
    case (QSocks5SocketEnginePrivate *)0x9:
      pQVar1 = d_func((QSocks5SocketEngine *)0x37587b);
      QSocks5SocketEnginePrivate::_q_controlSocketStateChanged
                (pQVar1,**(SocketState **)&(in_RCX->super_QAbstractSocketEnginePrivate).field_0x8);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 2) {
      if (**(int **)&(in_RCX->super_QAbstractSocketEnginePrivate).field_0x8 == 0) {
        local_20 = (QMetaTypeInterface *)QMetaType::fromType<QAbstractSocket::SocketError>();
        **(undefined8 **)&in_RCX->super_QAbstractSocketEnginePrivate = local_20;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)&in_RCX->super_QAbstractSocketEnginePrivate = local_18.d_ptr;
      }
    }
    else if (in_EDX == 9) {
      if (**(int **)&(in_RCX->super_QAbstractSocketEnginePrivate).field_0x8 == 0) {
        QVar2 = QMetaType::fromType<QAbstractSocket::SocketState>();
        **(undefined8 **)&in_RCX->super_QAbstractSocketEnginePrivate = QVar2.d_ptr;
      }
      else {
        memset(&local_28,0,8);
        QMetaType::QMetaType(&local_28);
        **(undefined8 **)&in_RCX->super_QAbstractSocketEnginePrivate = local_28.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)&in_RCX->super_QAbstractSocketEnginePrivate = local_10.d_ptr;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocks5SocketEngine::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSocks5SocketEngine *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_controlSocketConnected(); break;
        case 1: _t->d_func()->_q_controlSocketReadNotification(); break;
        case 2: _t->d_func()->_q_controlSocketErrorOccurred((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 3: _t->d_func()->_q_udpSocketReadNotification(); break;
        case 4: _t->d_func()->_q_controlSocketBytesWritten(); break;
        case 5: _t->d_func()->_q_emitPendingReadNotification(); break;
        case 6: _t->d_func()->_q_emitPendingWriteNotification(); break;
        case 7: _t->d_func()->_q_emitPendingConnectionNotification(); break;
        case 8: _t->d_func()->_q_controlSocketDisconnected(); break;
        case 9: _t->d_func()->_q_controlSocketStateChanged((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketState>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        case 9:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketState >(); break;
            }
            break;
        }
    }
}